

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void tiocapture(tiocxdef *tioctx,mcmcxdef *memctx,int flag)

{
  mcmcxdef *pmVar1;
  int in_EDX;
  mcmcxdef *in_RSI;
  int in_stack_00000020;
  mcmon in_stack_00000026;
  mcmon *in_stack_00000028;
  ushort in_stack_00000036;
  mcmcxdef *in_stack_00000038;
  
  pmVar1 = G_std_disp.capture_ctx;
  if ((in_EDX != 0) && (pmVar1 = in_RSI, G_std_disp.capture_obj == 0xffff)) {
    mcmalo0(in_stack_00000038,in_stack_00000036,in_stack_00000028,in_stack_00000026,
            in_stack_00000020);
    mcmunlck(in_RSI,(mcmon)((uint)in_EDX >> 0x10));
    pmVar1 = in_RSI;
  }
  G_std_disp.capture_ctx = pmVar1;
  G_std_disp.capturing = in_EDX;
  G_log_disp.capturing = in_EDX;
  return;
}

Assistant:

void tiocapture(tiocxdef *tioctx, mcmcxdef *memctx, int flag)
{
    if (flag)
    {
        /* create a new object if necessary */
        if (G_std_disp.capture_obj == MCMONINV)
        {
            mcmalo(memctx, 256, &G_std_disp.capture_obj);
            mcmunlck(memctx, G_std_disp.capture_obj);
        }

        /* remember the memory context */
        G_std_disp.capture_ctx = memctx;
    }

    /* 
     *   remember capture status in the standard output stream as well as
     *   the log stream 
     */
    G_std_disp.capturing = flag;
    G_log_disp.capturing = flag;
}